

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_copy_to_file.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalCopyToFile::Deserialize(LogicalCopyToFile *this,Deserializer *deserializer)

{
  pointer pcVar1;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var2;
  undefined1 auVar3 [8];
  _Alloc_hider _Var4;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var5;
  undefined1 uVar6;
  CopyFunctionReturnType CVar7;
  PreserveOrderType PVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ClientContext *context;
  undefined7 extraout_var;
  _func_int **pp_Var15;
  pointer pLVar16;
  InternalException *pIVar17;
  undefined1 write_part_cols;
  long lVar18;
  undefined1 uVar19;
  long *plVar20;
  string str_1;
  vector<unsigned_long,_true> partition_columns;
  string default_extension;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> file_extension;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  vector<duckdb::LogicalType,_true> expected_types;
  vector<duckdb::LogicalType,_true> types_to_write;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names_to_write;
  FilenamePattern filename_pattern;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> file_path;
  CopyFunction function;
  CopyOverwriteMode local_4cc;
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [24];
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_4a0 [2];
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> local_490;
  undefined1 local_488 [24];
  undefined1 local_470 [8];
  _Alloc_hider local_468;
  __uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_> local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  _Head_base<0UL,_duckdb::RegisteredStateManager_*,_false> local_448;
  tuple<duckdb::Logger_*,_std::default_delete<duckdb::Logger>_> local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  _Alloc_hider local_408;
  undefined1 local_400 [24];
  ClientContext *local_3e8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_3e0;
  undefined1 local_3d8 [32];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3b8;
  vector<duckdb::LogicalType,_true> local_3a0;
  vector<duckdb::LogicalType,_true> local_388;
  FilenamePattern local_370;
  reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>
  *local_340 [2];
  reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>
  local_330 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  undefined1 local_300 [32];
  undefined1 local_2e0 [88];
  __buckets_ptr local_288;
  undefined8 local_218;
  SimpleNamedParameterFunction local_208 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  _Alloc_hider local_50;
  size_type local_48;
  char local_40 [16];
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"file_path");
  (*deserializer->_vptr_Deserializer[0x1a])(local_340,deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"use_tmp_file");
  iVar9 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xca,"filename_pattern");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  FilenamePattern::Deserialize(&local_370,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcb,"overwrite_mode");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_2e0,deserializer);
    local_4cc = EnumUtil::FromString<duckdb::CopyOverwriteMode>((char *)local_2e0._0_8_);
    if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
      operator_delete((void *)local_2e0._0_8_);
    }
  }
  else {
    iVar10 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    local_4cc = (CopyOverwriteMode)iVar10;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcc,"per_thread_output");
  iVar10 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcd,"partition_output");
  iVar11 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xce,"partition_columns");
  local_488._0_8_ = (pointer)0x0;
  local_488._8_8_ = (_Elt_pointer)0x0;
  local_488._16_8_ = (unsigned_long *)0x0;
  iVar12 = (*deserializer->_vptr_Deserializer[8])(deserializer);
  lVar18 = CONCAT44(extraout_var_00,iVar12);
  if (lVar18 != 0) {
    do {
      iVar12 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
      local_2e0._0_8_ = CONCAT44(extraout_var_01,iVar12);
      if (local_488._8_8_ == local_488._16_8_) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
        _M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488,
                   (iterator)local_488._8_8_,(unsigned_long *)local_2e0);
      }
      else {
        *(undefined8 *)local_488._8_8_ = local_2e0._0_8_;
        local_488._8_8_ = local_488._8_8_ + 8;
      }
      lVar18 = lVar18 + -1;
    } while (lVar18 != 0);
  }
  (*deserializer->_vptr_Deserializer[9])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcf,"names");
  local_428._M_allocated_capacity = 0;
  local_428._8_8_ = 0;
  local_418._M_allocated_capacity = 0;
  iVar12 = (*deserializer->_vptr_Deserializer[8])(deserializer);
  lVar18 = CONCAT44(extraout_var_02,iVar12);
  if (lVar18 != 0) {
    do {
      (*deserializer->_vptr_Deserializer[0x1a])
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                 deserializer);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 local_428._M_local_buf,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0);
      if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
        operator_delete((void *)local_2e0._0_8_);
      }
      lVar18 = lVar18 + -1;
    } while (lVar18 != 0);
  }
  (*deserializer->_vptr_Deserializer[9])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&local_3b8,deserializer,0xd0,"expected_types");
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xd1,"copy_info");
  iVar12 = (*deserializer->_vptr_Deserializer[10])(deserializer);
  if ((char)iVar12 == '\0') {
    plVar20 = (long *)0x0;
  }
  else {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    ParseInfo::Deserialize((ParseInfo *)local_2e0,deserializer);
    plVar20 = (long *)local_2e0._0_8_;
    (*deserializer->_vptr_Deserializer[7])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[0xb])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  local_490.super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
  super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)
       (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)plVar20;
  context = Deserializer::Get<duckdb::ClientContext&>(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xd2,"function_name");
  (*deserializer->_vptr_Deserializer[0x1a])(local_3d8,deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pcVar1 = local_2e0 + 0x10;
  local_2e0._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"system","");
  local_4c8._0_8_ = local_4b8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"main","");
  local_468._M_p =
       (pointer)Catalog::GetEntry<duckdb::CopyFunctionCatalogEntry>
                          (context,(string *)local_2e0,(string *)local_4c8,(string *)local_3d8,
                           THROW_EXCEPTION,(QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::CopyFunctionCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::CopyFunctionCatalogEntry,_true> *)&local_468);
  _Var4._M_p = local_468._M_p;
  if ((type)local_4c8._0_8_ != (type)local_4b8) {
    operator_delete((void *)local_4c8._0_8_);
  }
  if ((pointer)local_2e0._0_8_ != pcVar1) {
    operator_delete((void *)local_2e0._0_8_);
  }
  if (_Var4._M_p[0x10] == COPY_FUNCTION_ENTRY) {
    CopyFunction::CopyFunction((CopyFunction *)local_2e0,(CopyFunction *)(_Var4._M_p + 0x120));
    local_4a0[0]._M_head_impl = (FunctionData *)0x0;
    (*deserializer->_vptr_Deserializer[2])(deserializer,0xd3,"function_has_serialize");
    iVar12 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    if ((char)iVar12 != '\0') {
      (*deserializer->_vptr_Deserializer[2])(deserializer,0xd4,"function_data");
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      (*(code *)local_218)((Deserializer *)local_4c8,(CopyFunction *)deserializer);
      _Var2._M_head_impl = local_4a0[0]._M_head_impl;
      local_4a0[0]._M_head_impl = (FunctionData *)local_4c8._0_8_;
      local_4c8._0_8_ = (type)0x0;
      if ((type)_Var2._M_head_impl != (type)0x0) {
        (*((ParseInfo *)&(_Var2._M_head_impl)->_vptr_FunctionData)->_vptr_ParseInfo[1])();
        if ((type)local_4c8._0_8_ != (type)0x0) {
          (**(code **)(*(long *)local_4c8._0_8_ + 8))();
        }
      }
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      (*deserializer->_vptr_Deserializer[3])(deserializer);
    }
    local_468._M_p = (pointer)&local_458;
    local_3e8 = context;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_468,local_50._M_p,local_50._M_p + local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_p == &local_458) {
      local_438._8_4_ = local_458._8_4_;
      local_438._12_4_ = local_458._12_4_;
      local_448._M_head_impl = (RegisteredStateManager *)&local_438;
    }
    else {
      local_448._M_head_impl = (RegisteredStateManager *)local_468._M_p;
    }
    local_438._M_allocated_capacity._4_4_ = local_458._M_allocated_capacity._4_4_;
    local_438._M_allocated_capacity._0_4_ = local_458._M_allocated_capacity._0_4_;
    local_440.super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
    super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>)
         (_Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>)
         local_460._M_t.
         super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
         super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl;
    local_460._M_t.super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
    super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl =
         (tuple<duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>)
         (_Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>)0x0;
    local_458._M_allocated_capacity._0_4_ = local_458._M_allocated_capacity._0_4_ & 0xffffff00;
    local_468._M_p = (pointer)&local_458;
    iVar13 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd5,"file_extension");
    if ((char)iVar13 == '\0') {
      (*deserializer->_vptr_Deserializer[5])(deserializer,0);
      local_408._M_p = local_400 + 8;
      if (local_448._M_head_impl == (RegisteredStateManager *)&local_438) {
        local_400._16_8_ = CONCAT44(local_438._12_4_,local_438._8_4_);
      }
      else {
        local_408._M_p = (pointer)local_448._M_head_impl;
      }
      local_400._0_8_ =
           local_440.super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
           super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl;
      local_440.super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
      super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>)
           (_Head_base<0UL,_duckdb::Logger_*,_false>)0x0;
      local_438._M_allocated_capacity = local_438._M_allocated_capacity & 0xffffffffffffff00;
      local_448._M_head_impl = (RegisteredStateManager *)&local_438;
    }
    else {
      (*deserializer->_vptr_Deserializer[0x1a])(&local_408,deserializer);
      (*deserializer->_vptr_Deserializer[5])(deserializer,1);
      if (local_448._M_head_impl != (RegisteredStateManager *)&local_438) {
        operator_delete(local_448._M_head_impl);
      }
    }
    uVar14 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd6,"rotate");
    pp_Var15 = deserializer->_vptr_Deserializer;
    if ((char)uVar14 == '\0') {
      uVar6 = false;
    }
    else {
      iVar13 = (*pp_Var15[0xc])(deserializer);
      uVar6 = (undefined1)iVar13;
      pp_Var15 = deserializer->_vptr_Deserializer;
    }
    (*pp_Var15[5])(deserializer,(ulong)(uVar14 & 0xff));
    iVar13 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd7,"return_type");
    if ((char)iVar13 == '\0') {
      local_4a0[1]._M_head_impl._4_4_ = 0;
      (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    }
    else {
      if (deserializer->deserialize_enum_from_string == true) {
        (*deserializer->_vptr_Deserializer[0x1a])(local_4c8,deserializer);
        CVar7 = EnumUtil::FromString<duckdb::CopyFunctionReturnType>((char *)local_4c8._0_8_);
        local_4a0[1]._M_head_impl._4_4_ = (undefined4)CONCAT71(extraout_var,CVar7);
        if ((type)local_4c8._0_8_ != (type)local_4b8) {
          operator_delete((void *)local_4c8._0_8_);
        }
      }
      else {
        local_4a0[1]._M_head_impl._4_4_ = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
      }
      (*deserializer->_vptr_Deserializer[5])(deserializer,1);
    }
    local_3e0._M_head_impl = &this->super_LogicalOperator;
    uVar14 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd8,"write_partition_columns");
    pp_Var15 = deserializer->_vptr_Deserializer;
    write_part_cols = true;
    if ((char)uVar14 != '\0') {
      iVar13 = (*pp_Var15[0xc])(deserializer);
      write_part_cols = (undefined1)iVar13;
      pp_Var15 = deserializer->_vptr_Deserializer;
    }
    (*pp_Var15[5])(deserializer,(ulong)(uVar14 & 0xff));
    uVar14 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd9,"write_empty_file");
    pp_Var15 = deserializer->_vptr_Deserializer;
    uVar19 = true;
    if ((char)uVar14 != '\0') {
      iVar13 = (*pp_Var15[0xc])(deserializer);
      uVar19 = (undefined1)iVar13;
      pp_Var15 = deserializer->_vptr_Deserializer;
    }
    (*pp_Var15[5])(deserializer,(ulong)(uVar14 & 0xff));
    iVar13 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xda,"preserve_order");
    if ((char)iVar13 == '\0') {
      PVar8 = AUTOMATIC;
      (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    }
    else {
      if (deserializer->deserialize_enum_from_string == true) {
        (*deserializer->_vptr_Deserializer[0x1a])(local_4c8,deserializer);
        PVar8 = EnumUtil::FromString<duckdb::PreserveOrderType>((char *)local_4c8._0_8_);
        if ((type)local_4c8._0_8_ != (type)local_4b8) {
          operator_delete((void *)local_4c8._0_8_);
        }
      }
      else {
        iVar13 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
        PVar8 = (PreserveOrderType)iVar13;
      }
      (*deserializer->_vptr_Deserializer[5])(deserializer,1);
    }
    if ((char)iVar12 == '\0') {
      if (local_288 == (__buckets_ptr)0x0) {
        pIVar17 = (InternalException *)__cxa_allocate_exception(0x10);
        local_4c8._0_8_ = local_4b8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_4c8,"Copy function \"%s\" has neither bind nor (de)serialize","")
        ;
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_320,local_2e0._8_8_,
                   (pointer)(local_2e0._8_8_ + local_2e0._16_8_));
        InternalException::InternalException<std::__cxx11::string>
                  (pIVar17,(string *)local_4c8,&local_320);
        __cxa_throw(pIVar17,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_4c8._0_8_ =
           unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator*
                     (&local_490);
      local_4b8._0_8_ = (_func_int **)0x0;
      local_4b8[8] = ALTER_INFO;
      local_4c8._8_8_ = (pointer)(local_4b8 + 8);
      GetNamesWithoutPartitions
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&local_388,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&local_428,(vector<unsigned_long,_true> *)local_488,(bool)write_part_cols);
      GetTypesWithoutPartitions
                (&local_3a0,(vector<duckdb::LogicalType,_true> *)&local_3b8,
                 (vector<unsigned_long,_true> *)local_488,(bool)write_part_cols);
      (*(code *)local_288)
                ((ClientContext *)local_470,(CopyFunctionBindInput *)local_3e8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_4c8,&local_388);
      auVar3 = local_470;
      _Var2._M_head_impl = local_4a0[0]._M_head_impl;
      local_470 = (undefined1  [8])0x0;
      local_4a0[0]._M_head_impl = (FunctionData *)auVar3;
      if ((type)_Var2._M_head_impl != (type)0x0) {
        (*((ParseInfo *)&(_Var2._M_head_impl)->_vptr_FunctionData)->_vptr_ParseInfo[1])();
        if (local_470 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_470 + 8))();
        }
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3a0);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_388);
      if ((pointer)local_4c8._8_8_ != (pointer)(local_4b8 + 8)) {
        operator_delete((void *)local_4c8._8_8_);
      }
    }
    make_uniq<duckdb::LogicalCopyToFile,duckdb::CopyFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::unique_ptr<duckdb::CopyInfo,std::default_delete<duckdb::CopyInfo>,true>>
              ((duckdb *)local_4c8,(CopyFunction *)local_2e0,
               (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               local_4a0,&local_490);
    pLVar16 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c8);
    ::std::__cxx11::string::_M_assign((string *)&pLVar16->file_path);
    pLVar16 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c8);
    pLVar16->use_tmp_file = SUB41(iVar9,0);
    pLVar16 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c8);
    ::std::__cxx11::string::_M_assign((string *)&pLVar16->filename_pattern);
    (pLVar16->filename_pattern).uuid = local_370.uuid;
    (pLVar16->filename_pattern).pos = local_370.pos;
    pLVar16 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c8);
    ::std::__cxx11::string::_M_assign((string *)&pLVar16->file_extension);
    pLVar16 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c8);
    pLVar16->overwrite_mode = local_4cc;
    pLVar16 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c8);
    pLVar16->per_thread_output = SUB41(iVar10,0);
    pLVar16 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c8);
    pLVar16->partition_output = SUB41(iVar11,0);
    pLVar16 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c8);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pLVar16->partition_columns,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488);
    pLVar16 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pLVar16->names,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_428);
    pLVar16 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &pLVar16->expected_types,&local_3b8);
    pLVar16 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c8);
    pLVar16->rotate = (bool)uVar6;
    pLVar16 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c8);
    pLVar16->return_type = (CopyFunctionReturnType)local_4a0[1]._M_head_impl._4_4_;
    pLVar16 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c8);
    pLVar16->write_partition_columns = (bool)write_part_cols;
    pLVar16 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c8);
    pLVar16->write_empty_file = (bool)uVar19;
    pLVar16 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
              ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                            *)local_4c8);
    _Var5._M_head_impl = local_3e0._M_head_impl;
    pLVar16->preserve_order = PVar8;
    (local_3e0._M_head_impl)->_vptr_LogicalOperator = (_func_int **)local_4c8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_400 + 8)) {
      operator_delete(local_408._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_p != &local_458) {
      operator_delete(local_468._M_p);
    }
    if ((type)local_4a0[0]._M_head_impl != (type)0x0) {
      (*((ParseInfo *)&(local_4a0[0]._M_head_impl)->_vptr_FunctionData)->_vptr_ParseInfo[1])();
    }
    local_2e0._0_8_ = &PTR__CopyFunction_02436038;
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p);
    }
    local_208[0].super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__TableFunction_02432fe0;
    if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
    }
    SimpleNamedParameterFunction::~SimpleNamedParameterFunction(local_208);
    Function::~Function((Function *)local_2e0);
    if ((_Hash_node_base *)local_3d8._0_8_ != (_Hash_node_base *)(local_3d8 + 0x10)) {
      operator_delete((void *)local_3d8._0_8_);
    }
    if (local_490.super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
        super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
        super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true,_true>)0x0) {
      (**(code **)(*(long *)local_490.
                            super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>
                            .super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl + 8))();
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3b8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_428._M_local_buf);
    if ((pointer)local_488._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_488._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.base._M_dataplus._M_p != &local_370.base.field_2) {
      operator_delete(local_370.base._M_dataplus._M_p);
    }
    if (local_340[0] != local_330) {
      operator_delete(local_340[0]);
    }
    return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           _Var5._M_head_impl;
  }
  pIVar17 = (InternalException *)__cxa_allocate_exception(0x10);
  local_2e0._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e0,"DeserializeFunction - cant find catalog entry for function %s","")
  ;
  local_300._0_8_ = local_300 + 0x10;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_300,local_3d8._0_8_,(undefined1 *)(local_3d8._8_8_ + local_3d8._0_8_));
  InternalException::InternalException<std::__cxx11::string>
            (pIVar17,(string *)local_2e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300);
  __cxa_throw(pIVar17,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<LogicalOperator> LogicalCopyToFile::Deserialize(Deserializer &deserializer) {
	auto file_path = deserializer.ReadProperty<string>(200, "file_path");
	auto use_tmp_file = deserializer.ReadProperty<bool>(201, "use_tmp_file");
	auto filename_pattern = deserializer.ReadProperty<FilenamePattern>(202, "filename_pattern");
	auto overwrite_mode = deserializer.ReadProperty<CopyOverwriteMode>(203, "overwrite_mode");
	auto per_thread_output = deserializer.ReadProperty<bool>(204, "per_thread_output");
	auto partition_output = deserializer.ReadProperty<bool>(205, "partition_output");
	auto partition_columns = deserializer.ReadProperty<vector<idx_t>>(206, "partition_columns");
	auto names = deserializer.ReadProperty<vector<string>>(207, "names");
	auto expected_types = deserializer.ReadProperty<vector<LogicalType>>(208, "expected_types");
	auto copy_info =
	    unique_ptr_cast<ParseInfo, CopyInfo>(deserializer.ReadProperty<unique_ptr<ParseInfo>>(209, "copy_info"));

	// Deserialize function
	auto &context = deserializer.Get<ClientContext &>();
	auto name = deserializer.ReadProperty<string>(210, "function_name");

	auto &func_catalog_entry =
	    Catalog::GetEntry<CopyFunctionCatalogEntry>(context, SYSTEM_CATALOG, DEFAULT_SCHEMA, name);
	if (func_catalog_entry.type != CatalogType::COPY_FUNCTION_ENTRY) {
		throw InternalException("DeserializeFunction - cant find catalog entry for function %s", name);
	}
	auto &function_entry = func_catalog_entry.Cast<CopyFunctionCatalogEntry>();
	auto function = function_entry.function;
	// Deserialize function data
	unique_ptr<FunctionData> bind_data;
	auto has_serialize = deserializer.ReadProperty<bool>(211, "function_has_serialize");
	if (has_serialize) {
		// Just deserialize the bind data
		deserializer.ReadObject(212, "function_data",
		                        [&](Deserializer &obj) { bind_data = function.deserialize(obj, function); });
	}

	auto default_extension = function.extension;

	auto file_extension =
	    deserializer.ReadPropertyWithExplicitDefault<string>(213, "file_extension", std::move(default_extension));

	auto rotate = deserializer.ReadPropertyWithExplicitDefault(214, "rotate", false);
	auto return_type =
	    deserializer.ReadPropertyWithExplicitDefault(215, "return_type", CopyFunctionReturnType::CHANGED_ROWS);
	auto write_partition_columns = deserializer.ReadPropertyWithExplicitDefault(216, "write_partition_columns", true);
	auto write_empty_file = deserializer.ReadPropertyWithExplicitDefault(217, "write_empty_file", true);
	auto preserve_order =
	    deserializer.ReadPropertyWithExplicitDefault(218, "preserve_order", PreserveOrderType::AUTOMATIC);

	if (!has_serialize) {
		// If not serialized, re-bind with the copy info
		if (!function.copy_to_bind) {
			throw InternalException("Copy function \"%s\" has neither bind nor (de)serialize", function.name);
		}

		CopyFunctionBindInput function_bind_input(*copy_info);
		auto names_to_write = GetNamesWithoutPartitions(names, partition_columns, write_partition_columns);
		auto types_to_write = GetTypesWithoutPartitions(expected_types, partition_columns, write_partition_columns);
		bind_data = function.copy_to_bind(context, function_bind_input, names_to_write, types_to_write);
	}

	auto result = make_uniq<LogicalCopyToFile>(function, std::move(bind_data), std::move(copy_info));
	result->file_path = file_path;
	result->use_tmp_file = use_tmp_file;
	result->filename_pattern = filename_pattern;
	result->file_extension = file_extension;
	result->overwrite_mode = overwrite_mode;
	result->per_thread_output = per_thread_output;
	result->partition_output = partition_output;
	result->partition_columns = partition_columns;
	result->names = names;
	result->expected_types = expected_types;
	result->rotate = rotate;
	result->return_type = return_type;
	result->write_partition_columns = write_partition_columns;
	result->write_empty_file = write_empty_file;
	result->preserve_order = preserve_order;

	return std::move(result);
}